

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::HasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  ImportInfo *pIVar6;
  long lVar7;
  cmake *this_01;
  char *pcVar8;
  undefined1 local_1d0 [16];
  string local_1c0;
  string install_name;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    pIVar6 = GetImportInfo(this,config);
    if (pIVar6 != (ImportInfo *)0x0) {
      if ((pIVar6->NoSOName == false) && ((pIVar6->SOName)._M_string_length != 0)) {
        bVar4 = false;
        lVar7 = std::__cxx11::string::find((char *)&pIVar6->SOName,0x4634ed);
        if (lVar7 != 0) {
          return false;
        }
      }
      else {
        install_name._M_dataplus._M_p = (pointer)&install_name.field_2;
        install_name._M_string_length = 0;
        install_name.field_2._M_local_buf[0] = '\0';
        cmSystemTools::GuessLibraryInstallName(&pIVar6->Location,&install_name);
        bVar4 = false;
        lVar7 = std::__cxx11::string::find((char *)&install_name,0x45d8ac);
        std::__cxx11::string::~string((string *)&install_name);
        if (lVar7 == -1) {
          return false;
        }
      }
LAB_00283df0:
      this_00 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&install_name,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG",
                 (allocator<char> *)(local_1d0 + 0x10));
      bVar1 = cmMakefile::IsSet(this_00,&install_name);
      std::__cxx11::string::~string((string *)&install_name);
      if (bVar1) {
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&install_name);
      std::operator<<((ostream *)&install_name,"Attempting to use ");
      pcVar8 = "@rpath";
      if (bVar4 != false) {
        pcVar8 = "MACOSX_RPATH";
      }
      std::operator<<((ostream *)&install_name,pcVar8);
      std::operator<<((ostream *)&install_name,
                      " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.");
      std::operator<<((ostream *)&install_name,
                      "  This could be because you are using a Mac OS X version");
      std::operator<<((ostream *)&install_name,
                      " less than 10.5 or because CMake\'s platform configuration is");
      std::operator<<((ostream *)&install_name," corrupt.");
      this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)local_1d0);
      cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1d0 + 0x10),
                          (cmListFileBacktrace *)local_1d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
      std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&install_name);
      return true;
    }
  }
  else {
    TVar5 = GetType(this);
    if (TVar5 == SHARED_LIBRARY) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&install_name,"INSTALL_NAME_DIR",(allocator<char> *)(local_1d0 + 0x10));
      pcVar8 = GetProperty(this,&install_name);
      std::__cxx11::string::~string((string *)&install_name);
      bVar2 = MacOSXUseInstallNameDir(this);
      bVar1 = pcVar8 == (char *)0x0;
      if (!bVar1 && bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&install_name,pcVar8,(allocator<char> *)(local_1d0 + 0x10));
        bVar3 = std::operator==(&install_name,"@rpath");
        std::__cxx11::string::~string((string *)&install_name);
        bVar4 = false;
        bVar1 = false;
        if (bVar3) goto LAB_00283df0;
      }
      if ((bVar1 || !bVar2) && (bVar4 = MacOSXRpathInstallNameDirDefault(this), bVar4))
      goto LAB_00283df0;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::HasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    const char* install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name &&
        std::string(install_name) == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (info->SOName.find("@rpath/") == 0) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}